

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O1

PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *
embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2
          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *a,
          PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  size_t sVar9;
  size_t sVar10;
  BBox1f BVar11;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *r;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *in_RDI;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  float fVar17;
  float fVar18;
  
  aVar15 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 = aVar15
  ;
  aVar1 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 = aVar1;
  aVar2 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 = aVar2;
  aVar3 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 = aVar3;
  aVar4 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar4;
  aVar5 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0;
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar5;
  sVar9 = a->num_time_segments;
  sVar10 = a->max_num_time_segments;
  BVar11 = a->time_range;
  in_RDI->max_time_range = a->max_time_range;
  in_RDI->time_range = BVar11;
  in_RDI->num_time_segments = sVar9;
  in_RDI->max_num_time_segments = sVar10;
  aVar15.m128 = (__m128)minps(aVar15.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0
                              .lower.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 = aVar15
  ;
  aVar15.m128 = (__m128)maxps(aVar1.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0
                              .upper.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 = aVar15
  ;
  aVar15.m128 = (__m128)minps(aVar2.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .lower.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 = aVar15
  ;
  aVar15.m128 = (__m128)maxps(aVar3.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .upper.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 = aVar15
  ;
  aVar15.m128 = (__m128)minps(aVar4.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
                              field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar15;
  aVar15.m128 = (__m128)maxps(aVar5.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
                              field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar15;
  fVar14 = (in_RDI->time_range).lower;
  fVar16 = (in_RDI->time_range).upper;
  fVar17 = (b->time_range).lower;
  fVar18 = (b->time_range).upper;
  uVar12 = -(uint)(fVar14 < fVar17);
  uVar13 = -(uint)(fVar16 < fVar18);
  in_RDI->time_range =
       (BBox1f)(CONCAT44(~uVar13 & (uint)fVar16,~uVar12 & (uint)fVar17) |
               CONCAT44((uint)fVar18 & uVar13,(uint)fVar14 & uVar12));
  uVar6 = (a->object_range)._begin;
  uVar7 = (a->object_range)._end;
  (in_RDI->object_range)._begin = uVar6;
  (in_RDI->object_range)._end = uVar7;
  uVar8 = (b->object_range)._end;
  (in_RDI->object_range)._begin = uVar6 + (b->object_range)._begin;
  (in_RDI->object_range)._end = uVar7 + uVar8;
  in_RDI->num_time_segments = in_RDI->num_time_segments + b->num_time_segments;
  if (in_RDI->max_num_time_segments < b->max_num_time_segments) {
    in_RDI->max_num_time_segments = b->max_num_time_segments;
    in_RDI->max_time_range = b->max_time_range;
  }
  return in_RDI;
}

Assistant:

static __forceinline const PrimInfoMBT merge2(const PrimInfoMBT& a, const PrimInfoMBT& b) {
        PrimInfoMBT r = a; r.merge(b); return r;
      }